

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::LibraryMapSyntax::setChild(LibraryMapSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *this_00;
  long in_RSI;
  long in_RDI;
  Token TVar1;
  SyntaxList<slang::syntax::MemberSyntax> *in_stack_ffffffffffffffc8;
  SyntaxList<slang::syntax::MemberSyntax> *this_01;
  undefined8 local_20;
  Info *local_18;
  
  this_01 = (SyntaxList<slang::syntax::MemberSyntax> *)&stack0x00000008;
  if (in_RSI == 0) {
    this_00 = TokenOrSyntax::node((TokenOrSyntax *)0x1e5b0a);
    SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::MemberSyntax>>(this_00);
    SyntaxList<slang::syntax::MemberSyntax>::operator=(this_01,in_stack_ffffffffffffffc8);
  }
  else {
    TVar1 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)in_stack_ffffffffffffffc8);
    local_20 = TVar1._0_8_;
    *(undefined8 *)(in_RDI + 0x50) = local_20;
    local_18 = TVar1.info;
    *(Info **)(in_RDI + 0x58) = local_18;
  }
  return;
}

Assistant:

void LibraryMapSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: members = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 1: endOfFile = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}